

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglConfigList.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::ConfigList::iterate(ConfigList *this)

{
  int iVar1;
  pointer ppvVar2;
  Library *egl_00;
  TestLog *this_00;
  NativeDisplay *nativeDisplay;
  size_type sVar3;
  reference ppvVar4;
  TestContext *this_01;
  Bitfield<16UL> *value;
  Bitfield<16UL> *value_00;
  Bitfield<16UL> *value_01;
  Enum<int,_2UL> EVar5;
  GetNameFunc local_250;
  int local_248;
  undefined1 local_240 [8];
  string transparentType;
  undefined1 local_208 [8];
  string surfaceTypes;
  undefined1 local_1d0 [8];
  string renderableTypes;
  undefined1 local_198 [8];
  string conformant;
  GetNameFunc local_168;
  int local_160;
  undefined1 local_158 [8];
  string caveat;
  GetNameFunc local_128;
  int local_120;
  undefined1 local_118 [8];
  string colorBufferType;
  undefined1 local_f0 [4];
  EGLint val;
  qpEglConfigInfo info;
  int i;
  undefined1 local_40 [8];
  vector<void_*,_std::allocator<void_*>_> configs;
  EGLDisplay display;
  TestLog *log;
  Library *egl;
  ConfigList *this_local;
  
  egl_00 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  eglu::getConfigs((vector<void_*,_std::allocator<void_*>_> *)local_40,egl_00,
                   configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  tcu::TestLog::startEglConfigSet(this_00,"EGL-configs","List of all EGL configs");
  info.transparentBlueValue = 0;
  while( true ) {
    iVar1 = info.transparentBlueValue;
    sVar3 = std::vector<void_*,_std::allocator<void_*>_>::size
                      ((vector<void_*,_std::allocator<void_*>_> *)local_40);
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    if ((int)sVar3 <= iVar1) break;
    colorBufferType.field_2._12_4_ = 0;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3020,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    local_f0 = (undefined1  [4])colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3024,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    val = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3023,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.bufferSize = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3022,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.redSize = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x303d,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.greenSize = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3021,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.blueSize = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x303e,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.luminanceSize = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3039,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.alphaSize = (int)(colorBufferType.field_2._12_4_ == 1);
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x303a,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.alphaMaskSize = (int)(colorBufferType.field_2._12_4_ == 1);
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x303f,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    EVar5 = eglu::getColorBufferTypeStr(colorBufferType.field_2._12_4_);
    caveat.field_2._8_8_ = EVar5.m_getName;
    local_120 = EVar5.m_value;
    local_128 = (GetNameFunc)caveat.field_2._8_8_;
    de::toString<tcu::Format::Enum<int,2ul>>((string *)local_118,(de *)&local_128,EVar5._8_8_);
    info._32_8_ = std::__cxx11::string::c_str();
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3027,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    EVar5 = eglu::getConfigCaveatStr(colorBufferType.field_2._12_4_);
    conformant.field_2._8_8_ = EVar5.m_getName;
    local_160 = EVar5.m_value;
    local_168 = (GetNameFunc)conformant.field_2._8_8_;
    de::toString<tcu::Format::Enum<int,2ul>>((string *)local_158,(de *)&local_168,EVar5._8_8_);
    info.colorBufferType = (char *)std::__cxx11::string::c_str();
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3028,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.configCaveat._0_4_ = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3042,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    eglu::getAPIBitsStr((Bitfield<16UL> *)((long)&renderableTypes.field_2 + 8),
                        colorBufferType.field_2._12_4_);
    de::toString<tcu::Format::Bitfield<16ul>>
              ((string *)local_198,(de *)(renderableTypes.field_2._M_local_buf + 8),value);
    info._56_8_ = std::__cxx11::string::c_str();
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3025,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.conformant._0_4_ = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3029,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.conformant._4_4_ = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x302c,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.depthSize = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x302a,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.level = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x302b,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.maxPBufferWidth = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x303c,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.maxPBufferHeight = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x303b,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.maxPBufferPixels = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x302d,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.maxSwapInterval = (int)(colorBufferType.field_2._12_4_ == 1);
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3040,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    eglu::getAPIBitsStr((Bitfield<16UL> *)((long)&surfaceTypes.field_2 + 8),
                        colorBufferType.field_2._12_4_);
    de::toString<tcu::Format::Bitfield<16ul>>
              ((string *)local_1d0,(de *)(surfaceTypes.field_2._M_local_buf + 8),value_00);
    info._96_8_ = std::__cxx11::string::c_str();
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3032,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.renderableType._0_4_ = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3031,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.renderableType._4_4_ = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3026,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.sampleBuffers = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3033,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    eglu::getSurfaceBitsStr
              ((Bitfield<16UL> *)((long)&transparentType.field_2 + 8),colorBufferType.field_2._12_4_
              );
    de::toString<tcu::Format::Bitfield<16ul>>
              ((string *)local_208,(de *)(transparentType.field_2._M_local_buf + 8),value_01);
    info._120_8_ = std::__cxx11::string::c_str();
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3034,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    EVar5 = eglu::getTransparentTypeStr(colorBufferType.field_2._12_4_);
    local_250 = EVar5.m_getName;
    local_248 = EVar5.m_value;
    de::toString<tcu::Format::Enum<int,2ul>>((string *)local_240,(de *)&local_250,EVar5._8_8_);
    info.surfaceTypes = (char *)std::__cxx11::string::c_str();
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3037,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.transparentType._0_4_ = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3036,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    ppvVar2 = configs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    info.transparentType._4_4_ = colorBufferType.field_2._12_4_;
    ppvVar4 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                        ((vector<void_*,_std::allocator<void_*>_> *)local_40,
                         (long)info.transparentBlueValue);
    (*egl_00->_vptr_Library[0x19])
              (egl_00,ppvVar2,*ppvVar4,0x3035,(undefined1 *)((long)&colorBufferType.field_2 + 0xc));
    info.transparentRedValue = colorBufferType.field_2._12_4_;
    tcu::TestLog::writeEglConfig(this_00,(qpEglConfigInfo *)local_f0);
    std::__cxx11::string::~string((string *)local_240);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)local_1d0);
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)local_118);
    info.transparentBlueValue = info.transparentBlueValue + 1;
  }
  tcu::TestLog::endEglConfigSet(this_00);
  (*egl_00->_vptr_Library[0x34])();
  this_01 = tcu::TestNode::getTestContext((TestNode *)this);
  tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,"");
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)local_40);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ConfigList::iterate (void)
{
	const Library&		egl			= m_eglTestCtx.getLibrary();
	tcu::TestLog&		log			= m_testCtx.getLog();
	EGLDisplay			display		= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	vector<EGLConfig>	configs		= eglu::getConfigs(egl, display);

	// \todo [2011-03-23 pyry] Check error codes!

	// \todo [kalle 10/08/2010] Get EGL version.

	log.startEglConfigSet("EGL-configs", "List of all EGL configs");

	// \todo [kalle 10/08/2010] Add validity checks for the values?
	// \todo [kalle 10/08/2010] Adapt for different EGL versions

	for (int i = 0; i < (int)configs.size(); i++)
	{
		qpEglConfigInfo info;
		EGLint val = 0;

		egl.getConfigAttrib(display, configs[i], EGL_BUFFER_SIZE, &val);
		info.bufferSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_RED_SIZE, &val);
		info.redSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_GREEN_SIZE, &val);
		info.greenSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_BLUE_SIZE, &val);
		info.blueSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_LUMINANCE_SIZE, &val);
		info.luminanceSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_ALPHA_SIZE, &val);
		info.alphaSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_ALPHA_MASK_SIZE, &val);
		info.alphaMaskSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_BIND_TO_TEXTURE_RGB, &val);
		info.bindToTextureRGB = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_BIND_TO_TEXTURE_RGBA, &val);
		info.bindToTextureRGBA = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_COLOR_BUFFER_TYPE, &val);
		std::string colorBufferType = de::toString(eglu::getColorBufferTypeStr(val));
		info.colorBufferType = colorBufferType.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_CONFIG_CAVEAT, &val);
		std::string caveat = de::toString(eglu::getConfigCaveatStr(val));
		info.configCaveat = caveat.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_CONFIG_ID, &val);
		info.configID = val;

		egl.getConfigAttrib(display, configs[i], EGL_CONFORMANT, &val);
		std::string conformant = de::toString(eglu::getAPIBitsStr(val));
		info.conformant = conformant.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_DEPTH_SIZE, &val);
		info.depthSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_LEVEL, &val);
		info.level = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_WIDTH, &val);
		info.maxPBufferWidth = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_HEIGHT, &val);
		info.maxPBufferHeight = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_PBUFFER_PIXELS, &val);
		info.maxPBufferPixels = val;

		egl.getConfigAttrib(display, configs[i], EGL_MAX_SWAP_INTERVAL, &val);
		info.maxSwapInterval = val;

		egl.getConfigAttrib(display, configs[i], EGL_MIN_SWAP_INTERVAL, &val);
		info.minSwapInterval = val;

		egl.getConfigAttrib(display, configs[i], EGL_NATIVE_RENDERABLE, &val);
		info.nativeRenderable = val == EGL_TRUE ? DE_TRUE : DE_FALSE;

		egl.getConfigAttrib(display, configs[i], EGL_RENDERABLE_TYPE, &val);
		std::string renderableTypes = de::toString(eglu::getAPIBitsStr(val));
		info.renderableType = renderableTypes.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_SAMPLE_BUFFERS, &val);
		info.sampleBuffers = val;

		egl.getConfigAttrib(display, configs[i], EGL_SAMPLES, &val);
		info.samples = val;

		egl.getConfigAttrib(display, configs[i], EGL_STENCIL_SIZE, &val);
		info.stencilSize = val;

		egl.getConfigAttrib(display, configs[i], EGL_SURFACE_TYPE, &val);
		std::string surfaceTypes = de::toString(eglu::getSurfaceBitsStr(val));
		info.surfaceTypes = surfaceTypes.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_TYPE, &val);
		std::string transparentType = de::toString(eglu::getTransparentTypeStr(val));
		info.transparentType = transparentType.c_str();

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_RED_VALUE, &val);
		info.transparentRedValue = val;

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_GREEN_VALUE, &val);
		info.transparentGreenValue = val;

		egl.getConfigAttrib(display, configs[i], EGL_TRANSPARENT_BLUE_VALUE, &val);
		info.transparentBlueValue = val;

		log.writeEglConfig(&info);
	}
	log.endEglConfigSet();

	egl.terminate(display);

	getTestContext().setTestResult(QP_TEST_RESULT_PASS, "");

	return TestNode::STOP;
}